

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

Json __thiscall slack::_detail::Slacking::post(Slacking *this,string *method,Json *json)

{
  Json *in_RCX;
  json_value extraout_RDX;
  Json JVar1;
  vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> elements;
  allocator local_79;
  vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> local_78;
  string local_60;
  string local_40;
  
  json_to_elements(&local_78,in_RCX);
  std::vector<slack::_detail::Element,std::allocator<slack::_detail::Element>>::
  emplace_back<char_const(&)[6],std::__cxx11::string&>
            ((vector<slack::_detail::Element,std::allocator<slack::_detail::Element>> *)&local_78,
             (char (*) [6])0x13143c,method + 6);
  std::__cxx11::string::string((string *)&local_60,"&",&local_79);
  join<slack::_detail::Element>(&local_40,&local_78,&local_60);
  post(this,method,(string *)json);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::~vector(&local_78)
  ;
  JVar1.m_value.object = extraout_RDX.object;
  JVar1._0_8_ = this;
  return JVar1;
}

Assistant:

Json post(const std::string& method, const Json& json) {
        
        auto elements = json_to_elements(json);
        elements.emplace_back("token", token_);
        return post(method, join(elements));
    }